

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Field.cpp
# Opt level: O0

void __thiscall
OpenMD::Field<OpenMD::Vector3<double>_>::process(Field<OpenMD::Vector3<double>_> *this)

{
  int iVar1;
  SnapshotManager *this_00;
  Snapshot *pSVar2;
  DumpReader *in_RDI;
  int istep;
  int nFrames;
  DumpReader reader;
  int local_1278;
  int in_stack_ffffffffffffedfc;
  DumpReader *in_stack_ffffffffffffee00;
  string *in_stack_ffffffffffffefc0;
  SimInfo *in_stack_ffffffffffffefc8;
  DumpReader *in_stack_ffffffffffffefd0;
  
  DumpReader::DumpReader
            (in_stack_ffffffffffffefd0,in_stack_ffffffffffffefc8,in_stack_ffffffffffffefc0);
  iVar1 = DumpReader::getNFrames(in_RDI);
  *(int *)&in_RDI->field_0xd0 = iVar1 / *(int *)&in_RDI->inFile_;
  for (local_1278 = 0; local_1278 < iVar1; local_1278 = *(int *)&in_RDI->inFile_ + local_1278) {
    DumpReader::readFrame(in_stack_ffffffffffffee00,in_stack_ffffffffffffedfc);
    this_00 = SimInfo::getSnapshotManager(*(SimInfo **)&in_RDI->filename_);
    pSVar2 = SnapshotManager::getCurrentSnapshot(this_00);
    *(Snapshot **)&in_RDI->field_0xc8 = pSVar2;
    (*(code *)(in_RDI->info_->randNumGen_).
              super___shared_ptr<OpenMD::Utils::RandNumGen,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi)(in_RDI,local_1278);
  }
  (**(code **)&in_RDI->info_->nAtoms_)();
  (**(code **)&in_RDI->info_->nInversions_)();
  (**(code **)&in_RDI->info_->nConstraints_)();
  DumpReader::~DumpReader(in_RDI);
  return;
}

Assistant:

void Field<T>::process() {
    DumpReader reader(info_, dumpFilename_);
    int nFrames = reader.getNFrames();
    nProcessed_ = nFrames / step_;

    for (int istep = 0; istep < nFrames; istep += step_) {
      reader.readFrame(istep);
      snap_ = info_->getSnapshotManager()->getCurrentSnapshot();
      processFrame(istep);
    }
    postProcess();
    writeField();
    writeVisualizationScript();
  }